

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O1

string * __thiscall
FastPForLib::NewPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  string __str;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
  *local_48[0] = 0x34;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x19dc29);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_98 = *puVar6;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar6;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_58 = 0x3631656c706d6953;
  local_60 = 8;
  local_50 = 0;
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  local_68 = &local_58;
  if ((local_a0 + 8U < 0x10) && (uVar8 < local_a0 + 8U)) {
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
  }
  else {
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)&local_58);
  }
  local_c8 = &local_b8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (undefined8 *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const {
    return "NewPFor<" + std::to_string(BlockSizeInUnitsOfPackSize) + "," + ecoder.name() + ">";
  }